

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O1

void oggpack_adv(oggpack_buffer *b,int bits)

{
  uint uVar1;
  uint uVar2;
  
  if (b->storage - (long)(b->endbit + bits + 7 >> 3) < b->endbyte) {
    b->ptr = (uchar *)0x0;
    b->endbyte = b->storage;
    uVar1 = 1;
  }
  else {
    uVar1 = b->endbit + bits;
    uVar2 = uVar1 + 7;
    if (-1 < (int)uVar1) {
      uVar2 = uVar1;
    }
    b->ptr = b->ptr + ((int)uVar2 >> 3);
    b->endbyte = b->endbyte + (long)((int)uVar2 >> 3);
    uVar1 = uVar1 & 7;
  }
  b->endbit = uVar1;
  return;
}

Assistant:

void oggpack_adv(oggpack_buffer *b,int bits){
  bits+=b->endbit;

  if(b->endbyte > b->storage-((bits+7)>>3)) goto overflow;

  b->ptr+=bits/8;
  b->endbyte+=bits/8;
  b->endbit=bits&7;
  return;

 overflow:
  b->ptr=NULL;
  b->endbyte=b->storage;
  b->endbit=1;
}